

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::Option::printOptionsDependencies(Option *this,FILE *pcsFile,int granularity)

{
  Option *pOVar1;
  int iVar2;
  char *pcVar3;
  char defaultAsString [2048];
  undefined1 auStack_828 [2056];
  
  pOVar1 = this->dependOnNonDefaultOf;
  if (pOVar1 != (Option *)0x0) {
    iVar2 = (*pOVar1->_vptr_Option[9])(pOVar1,(ulong)(uint)granularity);
    if ((char)iVar2 != '\0') {
      pcVar3 = strstr(this->name,"debug");
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strstr(this->description,"debug");
        if (pcVar3 == (char *)0x0) {
          pOVar1 = this->dependOnNonDefaultOf;
          pcVar3 = strstr(pOVar1->name,"debug");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strstr(pOVar1->description,"debug");
            if (pcVar3 == (char *)0x0) {
              iVar2 = (*this->_vptr_Option[10])(this);
              if ((char)iVar2 != '\0') {
                iVar2 = (*this->dependOnNonDefaultOf->_vptr_Option[10])();
                if ((char)iVar2 != '\0') {
                  (*this->dependOnNonDefaultOf->_vptr_Option[0xb])
                            (this->dependOnNonDefaultOf,(ulong)(uint)granularity,auStack_828,0x7ff);
                  pcVar3 = this->dependOnNonDefaultOf->name;
                  fprintf((FILE *)pcsFile,
                          "%s   | %s in {%s} #  only active, if %s has not its default value \n",
                          this->name,pcVar3,auStack_828,pcVar3);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void printOptionsDependencies(FILE *pcsFile, int granularity)
    {

        if (dependOnNonDefaultOf == 0) {
            return;
        } // no dependency
        if (!dependOnNonDefaultOf->canPrintOppositeOfDefault(granularity)) {
            return;
        } // cannot express opposite value of dependency-parent
        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its is related to debug output
        if (strstr(dependOnNonDefaultOf->name, "debug") != 0 || strstr(dependOnNonDefaultOf->description, "debug") != 0) {
            return;
        } // do not print the parameter, if its parent is related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print this option
        if (!dependOnNonDefaultOf->wouldPrintOption()) {
            return;
        } // do not print parent option

        char defaultAsString[2048]; // take care of HUGEVAL in double, or string values
        dependOnNonDefaultOf->getNonDefaultString(granularity, defaultAsString, 2047);
        assert(strlen(defaultAsString) < 2047 && "memory overflow");
        fprintf(pcsFile, "%s   | %s in {%s} #  only active, if %s has not its default value \n", name,
                dependOnNonDefaultOf->name, defaultAsString, dependOnNonDefaultOf->name);
    }